

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_get_rows_back(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_tensor *c)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  char *pcVar3;
  int line;
  
  if ((a->ne[2] == 1) && (a->ne[3] == 1)) {
    _Var1 = ggml_is_vector(b);
    if ((_Var1) && (b->type == GGML_TYPE_I32)) {
      if (((c->ne[2] == 1) && (c->ne[3] == 1)) && (a->ne[0] == c->ne[0])) {
        pgVar2 = ggml_new_tensor_2d(ctx,GGML_TYPE_F32,a->ne[0],c->ne[1]);
        pgVar2->op = GGML_OP_GET_ROWS_BACK;
        pgVar2->src[0] = a;
        pgVar2->src[1] = b;
        return pgVar2;
      }
      pcVar3 = "ggml_is_matrix(c) && (a->ne[0] == c->ne[0])";
      line = 0xd19;
      goto LAB_00122390;
    }
  }
  pcVar3 = "ggml_is_matrix(a) && ggml_is_vector(b) && b->type == GGML_TYPE_I32";
  line = 0xd18;
LAB_00122390:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar3);
}

Assistant:

struct ggml_tensor * ggml_get_rows_back(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        struct ggml_tensor  * c) {
    GGML_ASSERT(ggml_is_matrix(a) && ggml_is_vector(b) && b->type == GGML_TYPE_I32);
    GGML_ASSERT(ggml_is_matrix(c) && (a->ne[0] == c->ne[0]));

    // TODO: implement non F32 return
    //struct ggml_tensor * result = ggml_new_tensor_2d(ctx, a->type, a->ne[0], b->ne[0]);
    struct ggml_tensor * result = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, c->ne[0], c->ne[1]);

    result->op     = GGML_OP_GET_ROWS_BACK;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}